

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O2

void av1_nn_softmax(float *input,float *output,int n)

{
  int i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = *input;
  for (lVar1 = 1; lVar1 < n; lVar1 = lVar1 + 1) {
    if (fVar5 <= input[lVar1]) {
      fVar5 = input[lVar1];
    }
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  fVar6 = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    fVar4 = input[uVar3] - fVar5;
    if (fVar4 <= -10.0) {
      fVar4 = -10.0;
    }
    fVar4 = expf(fVar4);
    output[uVar3] = fVar4;
    fVar6 = fVar6 + fVar4;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    output[uVar3] = output[uVar3] / fVar6;
  }
  return;
}

Assistant:

void av1_nn_softmax(const float *input, float *output, int n) {
  // Softmax function is invariant to adding the same constant
  // to all input values, so we subtract the maximum input to avoid
  // possible overflow.
  float max_input = input[0];
  for (int i = 1; i < n; i++) max_input = AOMMAX(max_input, input[i]);
  float sum_out = 0.0f;
  for (int i = 0; i < n; i++) {
    // Clamp to range [-10.0, 0.0] to prevent FE_UNDERFLOW errors.
    const float normalized_input = AOMMAX(input[i] - max_input, -10.0f);
    output[i] = expf(normalized_input);
    sum_out += output[i];
  }
  for (int i = 0; i < n; i++) output[i] /= sum_out;
}